

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O2

ssize_t __thiscall
httplib::Stream::write_format<char_const*,char_const*>
          (Stream *this,char *fmt,char **args,char **args_1)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ssize_t sVar3;
  ulong uVar4;
  vector<char,_std::allocator<char>_> glowable_buf;
  array<char,_2048UL> buf;
  allocator_type local_849;
  _Vector_base<char,_std::allocator<char>_> local_848;
  char local_830 [2048];
  
  uVar1 = snprintf(local_830,0x7ff,fmt,*args,*args_1);
  if ((int)uVar1 < 1) {
    sVar3 = (ssize_t)(int)uVar1;
  }
  else {
    uVar4 = (ulong)uVar1;
    if (uVar1 < 0x7ff) {
      iVar2 = (*this->_vptr_Stream[5])(this,local_830,uVar4);
      sVar3 = CONCAT44(extraout_var,iVar2);
    }
    else {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&local_848,0x800,&local_849);
      while( true ) {
        if (uVar4 < ((long)local_848._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_848._M_impl.super__Vector_impl_data._M_start) - 1U) break;
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)&local_848,
                   ((long)local_848._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_848._M_impl.super__Vector_impl_data._M_start) * 2);
        iVar2 = snprintf(local_848._M_impl.super__Vector_impl_data._M_start,
                         (size_t)(local_848._M_impl.super__Vector_impl_data._M_finish +
                                 ~(ulong)local_848._M_impl.super__Vector_impl_data._M_start),fmt,
                         *args,*args_1);
        uVar4 = (ulong)iVar2;
      }
      iVar2 = (*this->_vptr_Stream[5])
                        (this,local_848._M_impl.super__Vector_impl_data._M_start,uVar4);
      sVar3 = CONCAT44(extraout_var_00,iVar2);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_848);
    }
  }
  return sVar3;
}

Assistant:

inline ssize_t Stream::write_format(const char* fmt, const Args &... args) {
        const auto bufsiz = 2048;
        std::array<char, bufsiz> buf;

#if defined(_MSC_VER) && _MSC_VER < 1900
        auto sn = _snprintf_s(buf.data(), bufsiz - 1, buf.size() - 1, fmt, args...);
#else
        auto sn = snprintf(buf.data(), buf.size() - 1, fmt, args...);
#endif
        if (sn <= 0) { return sn; }

        auto n = static_cast<size_t>(sn);

        if (n >= buf.size() - 1) {
            std::vector<char> glowable_buf(buf.size());

            while (n >= glowable_buf.size() - 1) {
                glowable_buf.resize(glowable_buf.size() * 2);
#if defined(_MSC_VER) && _MSC_VER < 1900
                n = static_cast<size_t>(_snprintf_s(&glowable_buf[0], glowable_buf.size(),
                    glowable_buf.size() - 1, fmt,
                    args...));
#else
                n = static_cast<size_t>(
                    snprintf(&glowable_buf[0], glowable_buf.size() - 1, fmt, args...));
#endif
            }
            return write(&glowable_buf[0], n);
        }
        else {
            return write(buf.data(), n);
        }
    }